

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void return_event(event_path_data evp,event_item *event)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  CManager in_RSI;
  timespec ts_1;
  timespec ts;
  undefined4 in_stack_ffffffffffffffc8;
  int line;
  CManager_conflict in_stack_ffffffffffffffd0;
  attr_list in_stack_ffffffffffffffd8;
  CManager in_stack_ffffffffffffffe0;
  undefined4 local_18;
  CMTraceType in_stack_ffffffffffffffec;
  
  *(int *)&in_RSI->transports = *(int *)&in_RSI->transports + -1;
  if (*(int *)&in_RSI->transports == 0) {
    line = in_RSI->initialized;
    if (line == 0) {
      if (in_RSI->pbio_requests != (_pending_format_requests *)0x0) {
        (*(code *)in_RSI->pbio_requests)(*(undefined8 *)&in_RSI->pending_request_max,0);
      }
    }
    else if (line == 1) {
      (*(code *)in_RSI->pbio_requests)
                (in_RSI->control_list,*(undefined8 *)&in_RSI->pending_request_max);
    }
    else if (line == 2) {
      if (in_RSI->control_list == (CMControlList)0x0) {
        iVar2 = CMtrace_val[9];
        if (in_RSI->reg_user_formats[0x24] == (CMFormat)0x0) {
          iVar2 = CMtrace_init(in_RSI,in_stack_ffffffffffffffec);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = (FILE *)in_RSI->reg_user_formats[0x24];
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xffffffffffffffd0);
            fprintf((FILE *)in_RSI->reg_user_formats[0x24],"%lld.%.9ld - ",in_stack_ffffffffffffffd0
                    ,in_stack_ffffffffffffffd8);
          }
          fprintf((FILE *)in_RSI->reg_user_formats[0x24],"RETURN encoded event %p\n",
                  in_RSI->control_list);
        }
        fflush((FILE *)in_RSI->reg_user_formats[0x24]);
        INT_CMreturn_buffer(in_stack_ffffffffffffffd0,
                            (void *)CONCAT44(line,in_stack_ffffffffffffffc8));
      }
      else {
        iVar2 = CMtrace_val[9];
        if (in_RSI->reg_user_formats[0x24] == (CMFormat)0x0) {
          iVar2 = CMtrace_init(in_RSI,in_stack_ffffffffffffffec);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = (FILE *)in_RSI->reg_user_formats[0x24];
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&stack0xffffffffffffffe0);
            fprintf((FILE *)in_RSI->reg_user_formats[0x24],"%lld.%.9ld - ",in_stack_ffffffffffffffe0
                    ,CONCAT44(in_stack_ffffffffffffffec,local_18));
          }
          fprintf((FILE *)in_RSI->reg_user_formats[0x24],"RETURN decoded event %p\n",
                  in_RSI->control_list);
        }
        fflush((FILE *)in_RSI->reg_user_formats[0x24]);
        INT_CMreturn_buffer(in_stack_ffffffffffffffd0,
                            (void *)CONCAT44(line,in_stack_ffffffffffffffc8));
      }
    }
    if (*(long *)&in_RSI->reg_user_format_count != 0) {
      CMint_free_attr_list
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (char *)in_stack_ffffffffffffffd0,line);
    }
    if (*(long *)&in_RSI->reg_format_count != 0) {
      free_FFSBuffer(*(undefined8 *)&in_RSI->reg_format_count);
    }
    free(in_RSI);
  }
  return;
}

Assistant:

extern void
return_event(event_path_data evp, event_item *event)
{
    (void)evp;
    event->ref_count--;
    if (event->ref_count == 0) {
	/* return event memory */
	switch (event->contents) {
	case Event_CM_Owned:
	    if (event->decoded_event) {
		CMtrace_out(event->cm, CMBufferVerbose, "RETURN decoded event %p\n", event->decoded_event);
		INT_CMreturn_buffer(event->cm, event->decoded_event);
	    } else {
		CMtrace_out(event->cm, CMBufferVerbose, "RETURN encoded event %p\n", event->decoded_event);
		INT_CMreturn_buffer(event->cm, event->encoded_event);
	    }
	    break;
	case Event_Freeable:
	    (event->free_func)(event->decoded_event, event->free_arg);
	    break;
	case Event_App_Owned:
	    if (event->free_func) {
		(event->free_func)(event->free_arg, NULL);
	    }
	    break;
	}
	if (event->attrs != NULL) INT_CMfree_attr_list(event->cm, event->attrs);
	if (event->ioBuffer != NULL)
	    free_FFSBuffer(event->ioBuffer);
	free(event);
    }
}